

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::DefaultPrintTo<std::vector<int,std::allocator<int>>>
               (undefined8 param_1,undefined8 *param_2,ostream *param_3)

{
  long lVar1;
  int *piVar3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  long lVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_33,1);
  piVar3 = (int *)*param_2;
  if (piVar3 != (int *)param_2[1]) {
    lVar2 = 0;
    do {
      lVar1 = lVar2 + -1;
      if ((lVar2 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_35,1), lVar2 == -0x20))
      {
        std::__ostream_insert<char,std::char_traits<char>>(param_3," ...",4);
        goto LAB_0012eff4;
      }
      std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_34,1);
      std::ostream::operator<<((ostream *)param_3,*piVar3);
      piVar3 = piVar3 + 1;
      lVar2 = lVar1;
    } while (piVar3 != (int *)param_2[1]);
    if (lVar1 != 0) {
LAB_0012eff4:
      std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_31,1);
  return;
}

Assistant:

void DefaultPrintTo(IsContainer /* dummy */,
                    false_type /* is not a pointer */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}